

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
(anonymous_namespace)::KeyParser::
FromPKHBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (KeyParser *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  long lVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ParseScriptContext ctx;
  pointer *__ptr;
  long in_FS_OFFSET;
  CPubKey pubkey;
  CKeyID keyid;
  uint160 hash;
  __uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  local_a8;
  CPubKey local_99;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)end._M_current - (long)begin._M_current != 0x14) {
    __assert_fail("end - begin == 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x6c9,
                  "std::optional<Key> (anonymous namespace)::KeyParser::FromPKHBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  if (*(long **)(this + 8) == (long *)0x0) {
    __assert_fail("m_in",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x6ca,
                  "std::optional<Key> (anonymous namespace)::KeyParser::FromPKHBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  if (end._M_current != begin._M_current) {
    local_28 = *(undefined4 *)(begin._M_current + 0x10);
    local_38 = *(undefined8 *)begin._M_current;
    uStack_30 = *(undefined8 *)(begin._M_current + 8);
  }
  local_48 = local_28;
  local_58 = (undefined4)local_38;
  uStack_54 = local_38._4_4_;
  uStack_50 = (undefined4)uStack_30;
  uStack_4c = uStack_30._4_4_;
  local_99.vch[0] = 0xff;
  cVar3 = (**(code **)(**(long **)(this + 8) + 0x20))();
  if (cVar3 != '\0') {
    ctx = P2WSH;
    if (*(int *)(this + 0x48) != 0) {
      if (*(int *)(this + 0x48) != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                      ,0x69e,
                      "ParseScriptContext (anonymous namespace)::KeyParser::ParseContext() const");
      }
      ctx = P2TR;
    }
    anon_unknown.dwarf_57514da::InferPubkey
              ((anon_unknown_dwarf_57514da *)&local_a8,&local_99,ctx,*(SigningProvider **)(this + 8)
              );
    if (local_a8._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
         )0x0) {
      lVar1 = *(long *)(this + 0x18);
      lVar2 = *(long *)(this + 0x10);
      std::
      vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
      ::emplace_back<>((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                        *)(this + 0x10));
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
      ::
      emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                  *)(*(long *)(this + 0x18) + -0x18),
                 (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)&local_a8);
      if ((_Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           )local_a8._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl !=
          (PubkeyProvider *)0x0) {
        (**(code **)(*(long *)local_a8._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                              .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>
                              ._M_head_impl + 8))();
      }
      uVar5 = (lVar1 - lVar2 >> 3) * -0x5555555555555555 & 0xffffffff;
      uVar4 = 0x100000000;
      goto LAB_00d9c7ce;
    }
  }
  uVar5 = 0;
  uVar4 = 0;
LAB_00d9c7ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (optional<unsigned_int>)(uVar4 | uVar5);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromPKHBytes(I begin, I end) const
    {
        assert(end - begin == 20);
        assert(m_in);
        uint160 hash;
        std::copy(begin, end, hash.begin());
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (m_in->GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ParseContext(), *m_in)) {
                Key key = m_keys.size();
                m_keys.emplace_back();
                m_keys.back().push_back(std::move(pubkey_provider));
                return key;
            }
        }
        return {};
    }